

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  ExprList_item *pEVar1;
  WhereTerm **ppWVar2;
  byte bVar3;
  ushort uVar4;
  sqlite3 *psVar5;
  char *zLeft;
  bool bVar6;
  bool bVar7;
  uint op;
  int iVar8;
  int iVar9;
  Expr *pEVar10;
  WhereTerm *pWVar11;
  CollSeq *pCVar12;
  Bitmask BVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  u8 *puVar22;
  short sVar23;
  ulong uVar24;
  undefined6 in_register_00000082;
  uint uVar25;
  ulong uVar26;
  Index *pIVar27;
  ExprList_item *pEVar28;
  char cVar29;
  bool bVar30;
  WhereLoop *local_f8;
  uint local_c4;
  ulong local_a0;
  ulong local_80;
  ulong local_78;
  
  psVar5 = pWInfo->pParse->db;
  if (((int)CONCAT62(in_register_00000082,nLoop) == 0) || ((psVar5->dbOptFlags & 0x80) == 0)) {
    uVar4 = (ushort)pOrderBy->nExpr;
    uVar17 = (ulong)uVar4;
    uVar16 = 0;
    if (uVar4 < 0x40) {
      op = ((wctrlFlags >> 0xb & 1) != 0) + 0x182;
      uVar18 = ~(-1L << ((byte)uVar4 & 0x3f));
      pEVar1 = pOrderBy->a;
      cVar29 = true;
      uVar16 = 0;
      local_f8 = (WhereLoop *)0x0;
      uVar19 = 0;
      local_78 = 0;
      local_a0 = 0;
LAB_00167d22:
      if (((!(bool)cVar29) || (uVar18 <= uVar19)) || (nLoop < uVar16)) goto LAB_0016839e;
      if (uVar16 != 0) {
        local_a0 = local_a0 | local_f8->maskSelf;
      }
      local_f8 = pLast;
      if ((nLoop <= uVar16) || (local_f8 = pPath->aLoop[uVar16], (wctrlFlags >> 0xb & 1) == 0)) {
        if ((local_f8->wsFlags & 0x400) != 0) {
          if ((local_f8->u).vtab.isOrdered != '\0') {
            uVar19 = uVar18;
          }
LAB_0016839e:
          uVar16 = uVar17;
          if ((uVar19 != uVar18) && (uVar16 = 0xff, !(bool)cVar29)) {
            do {
              if ((long)uVar17 < 2) goto LAB_001683cc;
              uVar17 = uVar17 - 1;
              uVar16 = uVar17;
            } while ((-1L << ((byte)uVar17 & 0x3f) | uVar19) != 0xffffffffffffffff);
          }
          goto LAB_001683ce;
        }
        (local_f8->u).btree.nIdxCol = 0;
        iVar9 = pWInfo->pTabList->a[local_f8->iTab].iCursor;
        for (uVar21 = 0; local_80 = 1, uVar21 != uVar17; uVar21 = uVar21 + 1) {
          if ((uVar19 >> (uVar21 & 0x3f) & 1) == 0) {
            pEVar10 = sqlite3ExprSkipCollate(pEVar1[uVar21].pExpr);
            if (((pEVar10->op == 0x98) && (pEVar10->iTable == iVar9)) &&
               (pWVar11 = sqlite3WhereFindTerm
                                    (&pWInfo->sWC,iVar9,(int)pEVar10->iColumn,~local_a0,op,
                                     (Index *)0x0), pWVar11 != (WhereTerm *)0x0)) {
              if (pWVar11->eOperator == 1) {
                uVar26 = 0;
                do {
                  if (local_f8->nLTerm == uVar26) goto LAB_00167eea;
                  ppWVar2 = local_f8->aLTerm + uVar26;
                  uVar26 = uVar26 + 1;
                } while (pWVar11 != *ppWVar2);
              }
              if (((pWVar11->eOperator & 0x82) != 0) && (-1 < pEVar10->iColumn)) {
                pCVar12 = sqlite3ExprCollSeq(pWInfo->pParse,pEVar1[uVar21].pExpr);
                if (pCVar12 == (CollSeq *)0x0) {
                  pCVar12 = psVar5->pDfltColl;
                }
                zLeft = pCVar12->zName;
                pCVar12 = sqlite3ExprCollSeq(pWInfo->pParse,pWVar11->pExpr);
                if (pCVar12 == (CollSeq *)0x0) {
                  pCVar12 = psVar5->pDfltColl;
                }
                iVar8 = sqlite3StrICmp(zLeft,pCVar12->zName);
                if (iVar8 != 0) goto LAB_00167eea;
              }
              uVar19 = uVar19 | 1L << ((byte)uVar21 & 0x3f);
            }
          }
LAB_00167eea:
        }
        if ((local_f8->wsFlags >> 0xc & 1) == 0) {
          if ((local_f8->wsFlags >> 8 & 1) == 0) {
            pIVar27 = (local_f8->u).btree.pIndex;
            if ((pIVar27 == (Index *)0x0) || ((pIVar27->field_0x63 & 4) != 0)) goto LAB_001683cc;
            local_c4 = (uint)pIVar27->nKeyCol;
            cVar29 = pIVar27->onError != '\0';
            uVar21 = (ulong)pIVar27->nColumn;
          }
          else {
            pIVar27 = (Index *)0x0;
            local_c4 = 0;
            uVar21 = local_80;
          }
          uVar26 = 0;
          bVar7 = false;
          bVar14 = 0;
          bVar6 = false;
LAB_00167fbb:
          if (uVar26 != uVar21) {
            uVar20 = (ulong)(local_f8->u).btree.nEq;
            if ((uVar20 <= uVar26) || (uVar26 < local_f8->nSkip)) {
LAB_00167fe9:
              uVar25 = 1;
LAB_00167fec:
              if (pIVar27 == (Index *)0x0) {
                bVar30 = false;
                bVar3 = 0;
                uVar15 = 0xffffffff;
              }
              else {
                sVar23 = pIVar27->aiColumn[uVar26];
                bVar3 = pIVar27->aSortOrder[uVar26];
                if (sVar23 == pIVar27->pTable->iPKey) {
                  sVar23 = -1;
                }
                uVar15 = (uint)sVar23;
                bVar30 = -1 < sVar23;
                if (((((bool)cVar29 != false) && (-1 < sVar23)) && (bVar30 = true, uVar20 <= uVar26)
                    ) && (pIVar27->pTable->aCol[uVar15].notNull == '\0')) {
                  cVar29 = false;
                }
              }
              uVar20 = 0;
              puVar22 = &pOrderBy->a[0].sortOrder;
              do {
                if (((char)uVar25 == '\0') || (uVar17 <= uVar20)) goto LAB_001682a7;
                if ((uVar19 >> (uVar20 & 0x3f) & 1) == 0) {
                  pEVar10 = sqlite3ExprSkipCollate(((ExprList_item *)(puVar22 + -0x18))->pExpr);
                  if ((wctrlFlags & 0xc0) == 0) {
                    uVar25 = wctrlFlags & 0xc0;
                  }
                  if ((int)uVar15 < -1) {
                    iVar8 = sqlite3ExprCompare((Parse *)0x0,pEVar10,
                                               pIVar27->aColExpr->a[uVar26].pExpr,iVar9);
                    if (iVar8 == 0) goto LAB_00168154;
                  }
                  else if (((pEVar10->op == 0x98) && (pEVar10->iTable == iVar9)) &&
                          (uVar15 == (int)pEVar10->iColumn)) {
LAB_00168154:
                    if (!bVar30) goto LAB_001681a4;
                    pCVar12 = sqlite3ExprCollSeq(pWInfo->pParse,
                                                 ((ExprList_item *)(puVar22 + -0x18))->pExpr);
                    if (pCVar12 == (CollSeq *)0x0) {
                      pCVar12 = psVar5->pDfltColl;
                    }
                    iVar8 = sqlite3StrICmp(pCVar12->zName,pIVar27->azColl[uVar26]);
                    if (iVar8 == 0) goto LAB_001681a4;
                  }
                }
                uVar20 = uVar20 + 1;
                puVar22 = puVar22 + 0x20;
              } while( true );
            }
            pWVar11 = local_f8->aLTerm[uVar26];
            uVar4 = pWVar11->eOperator;
            if ((op & uVar4) == 0) {
              if ((uVar4 & 1) != 0) {
                uVar24 = local_80;
                do {
                  if (uVar20 <= uVar24) goto LAB_00167fe9;
                  ppWVar2 = local_f8->aLTerm + uVar24;
                  uVar24 = uVar24 + 1;
                  uVar25 = 0;
                } while ((*ppWVar2)->pExpr != pWVar11->pExpr);
                goto LAB_00167fec;
              }
              goto LAB_00167fe9;
            }
            if ((uVar4 >> 8 & 1) != 0) {
              cVar29 = false;
            }
            goto LAB_00168292;
          }
LAB_001682dd:
          if (!bVar7 && cVar29 == '\0') {
            cVar29 = false;
            goto LAB_0016838e;
          }
        }
        local_78 = local_78 | local_f8->maskSelf;
        pEVar28 = pEVar1;
        for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
          uVar26 = 1L << ((byte)uVar21 & 0x3f);
          if ((uVar19 >> (uVar21 & 0x3f) & 1) == 0) {
            pEVar10 = pEVar28->pExpr;
            BVar13 = sqlite3WhereExprUsage(&pWInfo->sMaskSet,pEVar10);
            if ((BVar13 != 0) || (iVar9 = sqlite3ExprIsConstant(pEVar10), iVar9 != 0)) {
              if ((~local_78 & BVar13) != 0) {
                uVar26 = 0;
              }
              uVar19 = uVar19 | uVar26;
            }
          }
          pEVar28 = pEVar28 + 1;
        }
        cVar29 = true;
      }
LAB_0016838e:
      uVar16 = uVar16 + 1;
      goto LAB_00167d22;
    }
  }
  else {
LAB_001683cc:
    uVar16 = 0;
  }
LAB_001683ce:
  return (i8)uVar16;
LAB_001681a4:
  (local_f8->u).btree.nIdxCol = (short)uVar26 + 1;
  if ((char)((wctrlFlags & 0x40) >> 6) == '\0' && uVar20 < uVar17) {
    if (bVar6) {
      bVar6 = true;
      if ((bVar3 ^ bVar14) != *puVar22) {
LAB_001682a7:
        if ((uint)uVar26 < local_c4) {
          cVar29 = false;
        }
        if ((uint)uVar26 == 0) {
          cVar29 = (char)uVar26;
        }
        goto LAB_001682dd;
      }
    }
    else {
      bVar14 = *puVar22 ^ bVar3;
      bVar6 = true;
      if (*puVar22 != bVar3) {
        *pRevMask = *pRevMask | 1L << ((byte)uVar16 & 0x3f);
      }
    }
  }
  if (uVar15 == 0xffffffff) {
    bVar7 = true;
  }
  uVar19 = uVar19 | 1L << (uVar20 & 0x3f);
LAB_00168292:
  uVar26 = uVar26 + 1;
  local_80 = local_80 + 1;
  goto LAB_00167fbb;
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that 
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & WHERE_ORDERBY_LIMIT ) eqOpMask |= WO_IN;
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered ) obSat = obDone;
      break;
    }else{
      pLoop->u.btree.nIdxCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
      if( pOBExpr->op!=TK_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT 
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags & WHERE_ORDERBY_LIMIT );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        const char *z1, *z2;
        pColl = sqlite3ExprCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
        if( !pColl ) pColl = db->pDfltColl;
        z1 = pColl->zName;
        pColl = sqlite3ExprCollSeq(pWInfo->pParse, pTerm->pExpr);
        if( !pColl ) pColl = db->pDfltColl;
        z2 = pColl->zName;
        if( sqlite3StrICmp(z1, z2)!=0 ) continue;
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        isOrderDistinct = IsUniqueIndex(pIndex);
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq 
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing). 
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...)) 
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.  */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & WO_ISNULL ){
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;  
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j];
          if( iColumn==pIndex->pTable->iPKey ) iColumn = -1;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered
        */
        if( isOrderDistinct
         && iColumn>=0
         && j>=pLoop->u.btree.nEq
         && pIndex->pTable->aCol[iColumn].notNull==0
        ){
          isOrderDistinct = 0;
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off 
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=(-1) ){
            if( pOBExpr->op!=TK_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            if( sqlite3ExprCompare(0,
                  pOBExpr,pIndex->aColExpr->a[j].pExpr,iCur) ){
              continue;
            }
          }
          if( iColumn>=0 ){
            pColl = sqlite3ExprCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( !pColl ) pColl = db->pDfltColl;
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          pLoop->u.btree.nIdxCol = j+1;
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)!=pOrderBy->a[i].sortOrder ) isMatch = 0;
          }else{
            rev = revIdx ^ pOrderBy->a[i].sortOrder;
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = MASKBIT(i) - 1;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}